

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O0

void __thiscall
cmMakefile::cmMakefile
          (cmMakefile *this,cmGlobalGenerator *globalGenerator,cmStateSnapshot *snapshot)

{
  cmLinkedTree<cmStateDetail::SnapshotDataType> *pcVar1;
  bool bVar2;
  cmake *this_00;
  cmState *this_01;
  size_type sVar3;
  allocator<char> local_199;
  string local_198;
  allocator<char> local_171;
  string local_170;
  allocator<char> local_149;
  string local_148;
  allocator<char> local_121;
  string local_120;
  allocator<char> local_f9;
  string local_f8;
  allocator<char> local_d1;
  string local_d0;
  allocator<char> local_a9;
  string local_a8;
  PolicyMap local_88;
  cmStateSnapshot local_48;
  cmStateSnapshot *local_20;
  cmStateSnapshot *snapshot_local;
  cmGlobalGenerator *globalGenerator_local;
  cmMakefile *this_local;
  
  local_20 = snapshot;
  snapshot_local = (cmStateSnapshot *)globalGenerator;
  globalGenerator_local = (cmGlobalGenerator *)this;
  std::
  deque<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::deque(&this->FindPackageRootPathStack);
  std::set<cmListFileContext,_std::less<cmListFileContext>,_std::allocator<cmListFileContext>_>::set
            (&this->CMP0054ReportedIds);
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>_>_>
  ::unordered_map(&this->Targets);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map(&this->AliasTargets);
  std::vector<cmTarget_*,_std::allocator<cmTarget_*>_>::vector(&this->OrderedTargets);
  std::
  vector<std::unique_ptr<cmSourceFile,_std::default_delete<cmSourceFile>_>,_std::allocator<std::unique_ptr<cmSourceFile,_std::default_delete<cmSourceFile>_>_>_>
  ::vector(&this->SourceFiles);
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>_>_>
  ::unordered_map(&this->SourceFileSearchIndex);
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmSourceFile_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmSourceFile_*>_>_>
  ::unordered_map(&this->KnownFileSearchIndex);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<cmTest,_std::default_delete<cmTest>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<cmTest,_std::default_delete<cmTest>_>_>_>_>
  ::map(&this->Tests);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set(&this->SystemIncludeDirectories);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->ListFiles);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->OutputFiles);
  std::
  vector<std::unique_ptr<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_>,_std::allocator<std::unique_ptr<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_>_>_>
  ::vector(&this->InstallGenerators);
  std::
  vector<std::unique_ptr<cmTestGenerator,_std::default_delete<cmTestGenerator>_>,_std::allocator<std::unique_ptr<cmTestGenerator,_std::default_delete<cmTestGenerator>_>_>_>
  ::vector(&this->TestGenerators);
  std::__cxx11::string::string((string *)&this->ComplainFileRegularExpression);
  std::__cxx11::string::string((string *)&this->DefineFlags);
  std::__cxx11::string::string((string *)&this->DefineFlagsOrig);
  std::vector<cmSourceGroup,_std::allocator<cmSourceGroup>_>::vector(&this->SourceGroups);
  this->GlobalGenerator = (cmGlobalGenerator *)snapshot_local;
  (this->StateSnapshot).Position.Position = (local_20->Position).Position;
  pcVar1 = (local_20->Position).Tree;
  (this->StateSnapshot).State = local_20->State;
  (this->StateSnapshot).Position.Tree = pcVar1;
  cmListFileBacktrace::cmListFileBacktrace(&this->Backtrace);
  std::unique_ptr<cmMakefile::DeferCommands,std::default_delete<cmMakefile::DeferCommands>>::
  unique_ptr<std::default_delete<cmMakefile::DeferCommands>,void>
            ((unique_ptr<cmMakefile::DeferCommands,std::default_delete<cmMakefile::DeferCommands>> *
             )&this->Defer);
  this->DeferRunning = false;
  std::function<void_()>::function(&this->ExecuteCommandCallback);
  std::
  stack<std::unique_ptr<cmFunctionBlocker,std::default_delete<cmFunctionBlocker>>,std::vector<std::unique_ptr<cmFunctionBlocker,std::default_delete<cmFunctionBlocker>>,std::allocator<std::unique_ptr<cmFunctionBlocker,std::default_delete<cmFunctionBlocker>>>>>
  ::
  stack<std::vector<std::unique_ptr<cmFunctionBlocker,std::default_delete<cmFunctionBlocker>>,std::allocator<std::unique_ptr<cmFunctionBlocker,std::default_delete<cmFunctionBlocker>>>>,void>
            ((stack<std::unique_ptr<cmFunctionBlocker,std::default_delete<cmFunctionBlocker>>,std::vector<std::unique_ptr<cmFunctionBlocker,std::default_delete<cmFunctionBlocker>>,std::allocator<std::unique_ptr<cmFunctionBlocker,std::default_delete<cmFunctionBlocker>>>>>
              *)&this->FunctionBlockers);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&this->FunctionBlockerBarriers)
  ;
  std::stack<int,std::deque<int,std::allocator<int>>>::
  stack<std::deque<int,std::allocator<int>>,void>
            ((stack<int,std::deque<int,std::allocator<int>>> *)&this->LoopBlockCounter);
  cmsys::RegularExpression::RegularExpression(&this->cmDefineRegex);
  cmsys::RegularExpression::RegularExpression(&this->cmDefine01Regex);
  cmsys::RegularExpression::RegularExpression(&this->cmAtVarRegex);
  cmsys::RegularExpression::RegularExpression(&this->cmNamedCurly);
  std::vector<cmMakefile_*,_std::allocator<cmMakefile_*>_>::vector(&this->UnConfiguredDirectories);
  std::
  vector<std::unique_ptr<cmExportBuildFileGenerator,_std::default_delete<cmExportBuildFileGenerator>_>,_std::allocator<std::unique_ptr<cmExportBuildFileGenerator,_std::default_delete<cmExportBuildFileGenerator>_>_>_>
  ::vector(&this->ExportBuildFileGenerators);
  std::
  vector<std::unique_ptr<cmGeneratorExpressionEvaluationFile,_std::default_delete<cmGeneratorExpressionEvaluationFile>_>,_std::allocator<std::unique_ptr<cmGeneratorExpressionEvaluationFile,_std::default_delete<cmGeneratorExpressionEvaluationFile>_>_>_>
  ::vector(&this->EvaluationFiles);
  std::vector<cmExecutionStatus_*,_std::allocator<cmExecutionStatus_*>_>::vector
            (&this->ExecutionStatusStack);
  std::
  vector<std::unique_ptr<cmTarget,_std::default_delete<cmTarget>_>,_std::allocator<std::unique_ptr<cmTarget,_std::default_delete<cmTarget>_>_>_>
  ::vector(&this->ImportedTargetsOwned);
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget_*>_>_>
  ::unordered_map(&this->ImportedTargets);
  std::vector<BT<cmMakefile::GeneratorAction>,_std::allocator<BT<cmMakefile::GeneratorAction>_>_>::
  vector(&this->GeneratorActions);
  this->GeneratorActionsInvoked = false;
  this->DebugFindPkg = false;
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set(&this->WarnedCMP0074);
  this->CurrentImportedTargetScope = Local;
  this->IsSourceFileTryCompile = false;
  this_00 = GetCMakeInstance(this);
  bVar2 = cmake::GetCheckSystemVars(this_00);
  this->CheckSystemVars = bVar2;
  this->SuppressSideEffects = false;
  std::__cxx11::string::operator=((string *)&this->ComplainFileRegularExpression,"^$");
  std::__cxx11::string::operator=((string *)&this->DefineFlags," ");
  cmsys::RegularExpression::compile
            (&this->cmDefineRegex,"#([ \t]*)cmakedefine[ \t]+([A-Za-z_0-9]*)");
  cmsys::RegularExpression::compile
            (&this->cmDefine01Regex,"#([ \t]*)cmakedefine01[ \t]+([A-Za-z_0-9]*)");
  cmsys::RegularExpression::compile(&this->cmAtVarRegex,"(@[A-Za-z_0-9/.+-]+@)");
  cmsys::RegularExpression::compile(&this->cmNamedCurly,"^[A-Za-z0-9/_.+-]+{");
  this_01 = cmStateSnapshot::GetState(&this->StateSnapshot);
  cmState::CreatePolicyScopeSnapshot(&local_48,this_01,&this->StateSnapshot);
  (this->StateSnapshot).Position.Position = local_48.Position.Position;
  (this->StateSnapshot).State = local_48.State;
  (this->StateSnapshot).Position.Tree = local_48.Position.Tree;
  this->RecursionDepth = 0;
  local_88.Status.super__Base_bitset<7UL>._M_w[4] = 0;
  local_88.Status.super__Base_bitset<7UL>._M_w[5] = 0;
  local_88.Status.super__Base_bitset<7UL>._M_w[2] = 0;
  local_88.Status.super__Base_bitset<7UL>._M_w[3] = 0;
  local_88.Status.super__Base_bitset<7UL>._M_w[0] = 0;
  local_88.Status.super__Base_bitset<7UL>._M_w[1] = 0;
  local_88.Status.super__Base_bitset<7UL>._M_w[6] = 0;
  cmPolicies::PolicyMap::PolicyMap(&local_88);
  PushPolicy(this,false,&local_88);
  PushLoopBlockBarrier(this);
  this->CheckCMP0000 = false;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_a8,"",&local_a9);
  AddSourceGroup(this,&local_a8,"^.*$");
  std::__cxx11::string::~string((string *)&local_a8);
  std::allocator<char>::~allocator(&local_a9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_d0,"Source Files",&local_d1);
  AddSourceGroup(this,&local_d0,
                 "\\.(C|F|M|c|c\\+\\+|cc|cpp|mpp|cxx|ixx|cppm|cu|f|f90|for|fpp|ftn|m|mm|rc|def|r|odl|idl|hpj|bat)$"
                );
  std::__cxx11::string::~string((string *)&local_d0);
  std::allocator<char>::~allocator(&local_d1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_f8,"Header Files",&local_f9);
  AddSourceGroup(this,&local_f8,"\\.(h|hh|h\\+\\+|hm|hpp|hxx|in|txx|inl)$");
  std::__cxx11::string::~string((string *)&local_f8);
  std::allocator<char>::~allocator(&local_f9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_120,"Precompile Header File",&local_121);
  AddSourceGroup(this,&local_120,"cmake_pch(_[^.]+)?\\.(h|hxx)$");
  std::__cxx11::string::~string((string *)&local_120);
  std::allocator<char>::~allocator(&local_121);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_148,"CMake Rules",&local_149);
  AddSourceGroup(this,&local_148,"\\.rule$");
  std::__cxx11::string::~string((string *)&local_148);
  std::allocator<char>::~allocator(&local_149);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_170,"Resources",&local_171);
  AddSourceGroup(this,&local_170,"\\.(pdf|plist|png|jpeg|jpg|storyboard|xcassets)$");
  std::__cxx11::string::~string((string *)&local_170);
  std::allocator<char>::~allocator(&local_171);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_198,"Object Files",&local_199)
  ;
  AddSourceGroup(this,&local_198,"\\.(lo|o|obj)$");
  std::__cxx11::string::~string((string *)&local_198);
  std::allocator<char>::~allocator(&local_199);
  sVar3 = std::vector<cmSourceGroup,_std::allocator<cmSourceGroup>_>::size(&this->SourceGroups);
  this->ObjectLibrariesSourceGroupIndex = sVar3;
  std::vector<cmSourceGroup,std::allocator<cmSourceGroup>>::
  emplace_back<char_const(&)[17],char_const(&)[19]>
            ((vector<cmSourceGroup,std::allocator<cmSourceGroup>> *)&this->SourceGroups,
             (char (*) [17])"Object Libraries",(char (*) [19])"^MATCH_NO_SOURCES$");
  return;
}

Assistant:

cmMakefile::cmMakefile(cmGlobalGenerator* globalGenerator,
                       cmStateSnapshot const& snapshot)
  : GlobalGenerator(globalGenerator)
  , StateSnapshot(snapshot)
{
  this->IsSourceFileTryCompile = false;

  this->CheckSystemVars = this->GetCMakeInstance()->GetCheckSystemVars();

  this->SuppressSideEffects = false;

  // Setup the default include complaint regular expression (match nothing).
  this->ComplainFileRegularExpression = "^$";

  this->DefineFlags = " ";

  this->cmDefineRegex.compile("#([ \t]*)cmakedefine[ \t]+([A-Za-z_0-9]*)");
  this->cmDefine01Regex.compile("#([ \t]*)cmakedefine01[ \t]+([A-Za-z_0-9]*)");
  this->cmAtVarRegex.compile("(@[A-Za-z_0-9/.+-]+@)");
  this->cmNamedCurly.compile("^[A-Za-z0-9/_.+-]+{");

  this->StateSnapshot =
    this->StateSnapshot.GetState()->CreatePolicyScopeSnapshot(
      this->StateSnapshot);
  this->RecursionDepth = 0;

  // Enter a policy level for this directory.
  this->PushPolicy();

  // push empty loop block
  this->PushLoopBlockBarrier();

  // By default the check is not done.  It is enabled by
  // cmListFileCache in the top level if necessary.
  this->CheckCMP0000 = false;

#if !defined(CMAKE_BOOTSTRAP)
  this->AddSourceGroup("", "^.*$");
  this->AddSourceGroup("Source Files", CM_SOURCE_REGEX);
  this->AddSourceGroup("Header Files", CM_HEADER_REGEX);
  this->AddSourceGroup("Precompile Header File", CM_PCH_REGEX);
  this->AddSourceGroup("CMake Rules", "\\.rule$");
  this->AddSourceGroup("Resources", CM_RESOURCE_REGEX);
  this->AddSourceGroup("Object Files", "\\.(lo|o|obj)$");

  this->ObjectLibrariesSourceGroupIndex = this->SourceGroups.size();
  this->SourceGroups.emplace_back("Object Libraries", "^MATCH_NO_SOURCES$");
#endif
}